

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocl_init.cpp
# Opt level: O0

OclLibrary oclLoadLibrary(void)

{
  OclLibrary local_10;
  OclLibrary lib;
  
  local_10 = (OclLibrary)dlopen("libOpenCL.so",2);
  if (local_10 == (OclLibrary)0x0) {
    local_10 = (OclLibrary)dlopen("libOpenCL.so.1",2);
  }
  return local_10;
}

Assistant:

OclLibrary oclLoadLibrary(void)
{
#if defined(__APPLE__) || defined(__MACOSX)
	return dlopen("/System/Library/Frameworks/OpenCL.framework/Versions/Current/OpenCL", RTLD_NOW);
#else
	OclLibrary lib = dlopen("libOpenCL.so", RTLD_NOW);
	if (!lib) {
		lib = dlopen("libOpenCL.so.1", RTLD_NOW);
	}
	return lib;
#endif
}